

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash3.cpp
# Opt level: O1

void MurmurHash3_x86_128(void *key,int len,uint32_t seed,void *out)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  uVar8 = len;
  if (len < 0) {
    uVar8 = len + 0xfU;
  }
  lVar4 = (long)(int)(uVar8 & 0xfffffff0);
  uVar7 = seed;
  uVar10 = seed;
  uVar11 = seed;
  if (0x1e < len + 0xfU) {
    lVar6 = (long)((int)uVar8 >> 4);
    piVar1 = (int *)((long)key + lVar4 + lVar6 * -0x10 + 0xc);
    do {
      uVar8 = ((uint)(piVar1[-3] * 0x239b961b) >> 0x11 | piVar1[-3] * -0x34f28000) * -0x54f16877 ^
              seed;
      iVar9 = (uVar8 << 0x13 | uVar8 >> 0xd) + uVar7;
      seed = iVar9 * 5 + 0x561ccd1b;
      uVar7 = ((uint)(piVar1[-2] * -0x54f16877) >> 0x10 | piVar1[-2] * -0x68770000) * 0x38b34ae5 ^
              uVar7;
      uVar7 = ((uVar7 << 0x11 | uVar7 >> 0xf) + uVar10) * 5 + 0xbcaa747;
      uVar10 = ((uint)(piVar1[-1] * 0x38b34ae5) >> 0xf | piVar1[-1] * -0x6a360000) * -0x5e1c746d ^
               uVar10;
      uVar10 = ((uVar10 << 0xf | uVar10 >> 0x11) + uVar11) * 5 + 0x96cd1c35;
      uVar11 = ((uint)(*piVar1 * -0x5e1c746d) >> 0xe | *piVar1 * 0x2e4c0000) * 0x239b961b ^ uVar11;
      uVar11 = ((uVar11 << 0xd | uVar11 >> 0x13) + iVar9 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
      piVar1 = piVar1 + 4;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  uVar5 = 0;
  uVar8 = 0;
  switch(len & 0xf) {
  case 0xf:
    uVar8 = (uint)*(byte *)((long)key + lVar4 + 0xe) << 0x10;
  case 0xe:
    uVar8 = uVar8 | (uint)*(byte *)((long)key + lVar4 + 0xd) << 8;
  case 0xd:
    uVar8 = *(byte *)((long)key + lVar4 + 0xc) ^ uVar8;
    uVar11 = uVar11 ^ (uVar8 * -0x5e1c746d >> 0xe | uVar8 * 0x2e4c0000) * 0x239b961b;
  case 0xc:
    uVar8 = (uint)*(byte *)((long)key + lVar4 + 0xb) << 0x18;
  case 0xb:
    uVar8 = uVar8 | (uint)*(byte *)((long)key + lVar4 + 10) << 0x10;
  case 10:
    uVar8 = uVar8 ^ (uint)*(byte *)((long)key + lVar4 + 9) << 8;
  case 9:
    uVar8 = *(byte *)((long)key + lVar4 + 8) ^ uVar8;
    uVar10 = uVar10 ^ (uVar8 * 0x38b34ae5 >> 0xf | uVar8 * -0x6a360000) * -0x5e1c746d;
  case 8:
    uVar8 = (uint)*(byte *)((long)key + lVar4 + 7) << 0x18;
  case 7:
    uVar8 = uVar8 | (uint)*(byte *)((long)key + lVar4 + 6) << 0x10;
  case 6:
    uVar8 = uVar8 ^ (uint)*(byte *)((long)key + lVar4 + 5) << 8;
  case 5:
    uVar8 = *(byte *)((long)key + lVar4 + 4) ^ uVar8;
    uVar7 = uVar7 ^ (uVar8 * -0x54f16877 >> 0x10 | uVar8 * -0x68770000) * 0x38b34ae5;
  case 4:
    uVar8 = (uint)*(byte *)((long)key + lVar4 + 3) << 0x18;
  case 3:
    uVar5 = uVar8 | (uint)*(byte *)((long)key + lVar4 + 2) << 0x10;
  case 2:
    uVar5 = uVar5 ^ (uint)*(byte *)((long)key + lVar4 + 1) << 8;
  case 1:
    uVar5 = *(byte *)((long)key + lVar4) ^ uVar5;
    seed = seed ^ (uVar5 * 0x239b961b >> 0x11 | uVar5 * -0x34f28000) * -0x54f16877;
  case 0:
    uVar5 = (seed ^ len) + (uVar7 ^ len) + (uVar10 ^ len) + (uVar11 ^ len);
    uVar3 = (uVar7 ^ len) + uVar5;
    uVar2 = (uVar10 ^ len) + uVar5;
    uVar8 = (uVar11 ^ len) + uVar5;
    uVar7 = (uVar5 >> 0x10 ^ uVar5) * -0x7a143595;
    uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
    uVar10 = (uVar3 >> 0x10 ^ uVar3) * -0x7a143595;
    uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
    uVar10 = uVar10 >> 0x10 ^ uVar10;
    uVar11 = (uVar2 >> 0x10 ^ uVar2) * -0x7a143595;
    uVar11 = (uVar11 >> 0xd ^ uVar11) * -0x3d4d51cb;
    uVar11 = uVar11 >> 0x10 ^ uVar11;
    uVar8 = (uVar8 >> 0x10 ^ uVar8) * -0x7a143595;
    uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
    uVar8 = uVar8 >> 0x10 ^ uVar8;
    iVar9 = (uVar7 >> 0x10 ^ uVar7) + uVar10 + uVar11 + uVar8;
    *(int *)out = iVar9;
    *(uint *)((long)out + 4) = uVar10 + iVar9;
    *(uint *)((long)out + 8) = uVar11 + iVar9;
    *(uint *)((long)out + 0xc) = uVar8 + iVar9;
    return;
  }
}

Assistant:

void MurmurHash3_x86_128 ( const void * key, const int len,
                           uint32_t seed, void * out )
{
  const uint8_t * data = (const uint8_t*)key;
  const int nblocks = len / 16;

  uint32_t h1 = seed;
  uint32_t h2 = seed;
  uint32_t h3 = seed;
  uint32_t h4 = seed;

  const uint32_t c1 = 0x239b961b; 
  const uint32_t c2 = 0xab0e9789;
  const uint32_t c3 = 0x38b34ae5; 
  const uint32_t c4 = 0xa1e38b93;

  //----------
  // body

  const uint32_t * blocks = (const uint32_t *)(data + nblocks*16);

  for(int i = -nblocks; i; i++)
  {
    uint32_t k1 = getblock32(blocks,i*4+0);
    uint32_t k2 = getblock32(blocks,i*4+1);
    uint32_t k3 = getblock32(blocks,i*4+2);
    uint32_t k4 = getblock32(blocks,i*4+3);

    k1 *= c1; k1  = ROTL32(k1,15); k1 *= c2; h1 ^= k1;

    h1 = ROTL32(h1,19); h1 += h2; h1 = h1*5+0x561ccd1b;

    k2 *= c2; k2  = ROTL32(k2,16); k2 *= c3; h2 ^= k2;

    h2 = ROTL32(h2,17); h2 += h3; h2 = h2*5+0x0bcaa747;

    k3 *= c3; k3  = ROTL32(k3,17); k3 *= c4; h3 ^= k3;

    h3 = ROTL32(h3,15); h3 += h4; h3 = h3*5+0x96cd1c35;

    k4 *= c4; k4  = ROTL32(k4,18); k4 *= c1; h4 ^= k4;

    h4 = ROTL32(h4,13); h4 += h1; h4 = h4*5+0x32ac3b17;
  }

  //----------
  // tail

  const uint8_t * tail = (const uint8_t*)(data + nblocks*16);

  uint32_t k1 = 0;
  uint32_t k2 = 0;
  uint32_t k3 = 0;
  uint32_t k4 = 0;

  switch(len & 15)
  {
  case 15: k4 ^= tail[14] << 16;
  case 14: k4 ^= tail[13] << 8;
  case 13: k4 ^= tail[12] << 0;
           k4 *= c4; k4  = ROTL32(k4,18); k4 *= c1; h4 ^= k4;

  case 12: k3 ^= tail[11] << 24;
  case 11: k3 ^= tail[10] << 16;
  case 10: k3 ^= tail[ 9] << 8;
  case  9: k3 ^= tail[ 8] << 0;
           k3 *= c3; k3  = ROTL32(k3,17); k3 *= c4; h3 ^= k3;

  case  8: k2 ^= tail[ 7] << 24;
  case  7: k2 ^= tail[ 6] << 16;
  case  6: k2 ^= tail[ 5] << 8;
  case  5: k2 ^= tail[ 4] << 0;
           k2 *= c2; k2  = ROTL32(k2,16); k2 *= c3; h2 ^= k2;

  case  4: k1 ^= tail[ 3] << 24;
  case  3: k1 ^= tail[ 2] << 16;
  case  2: k1 ^= tail[ 1] << 8;
  case  1: k1 ^= tail[ 0] << 0;
           k1 *= c1; k1  = ROTL32(k1,15); k1 *= c2; h1 ^= k1;
  };

  //----------
  // finalization

  h1 ^= len; h2 ^= len; h3 ^= len; h4 ^= len;

  h1 += h2; h1 += h3; h1 += h4;
  h2 += h1; h3 += h1; h4 += h1;

  h1 = fmix32(h1);
  h2 = fmix32(h2);
  h3 = fmix32(h3);
  h4 = fmix32(h4);

  h1 += h2; h1 += h3; h1 += h4;
  h2 += h1; h3 += h1; h4 += h1;

  ((uint32_t*)out)[0] = h1;
  ((uint32_t*)out)[1] = h2;
  ((uint32_t*)out)[2] = h3;
  ((uint32_t*)out)[3] = h4;
}